

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::InvariantOuterEdge::OuterEdgeDivisionTestInstance::iterate
          (TestStatus *__return_storage_ptr__,OuterEdgeDivisionTestInstance *this)

{
  ostringstream *poVar1;
  ostream *poVar2;
  float constantOuterLevel;
  TestLog *pTVar3;
  deInt32 dVar4;
  bool bVar5;
  int iVar6;
  undefined1 usePointMode;
  int iVar7;
  float *pfVar8;
  float *outer;
  pointer pfVar9;
  OuterEdgeDescription *edgeDesc;
  Winding winding;
  _anonymous_namespace_ *this_00;
  float *pfVar10;
  long lVar11;
  _anonymous_namespace_ *p_Var12;
  _Rb_tree_header *p_Var13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  vector<float,_std::allocator<float>_> patchTessLevels;
  Vec3Set outerEdgeVertices;
  Vec3Set firstOuterEdgeVertices;
  string local_288;
  long local_268;
  long local_260;
  long local_258;
  pointer local_250;
  float *local_248;
  pointer local_240;
  string local_238;
  DrawResult result;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  lVar14 = 0;
  do {
    if ((int)((ulong)((long)(this->super_BaseTestInstance).m_edgeDescriptions.
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->super_BaseTestInstance).m_edgeDescriptions.
                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) <= lVar14) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,"OK",(allocator<char> *)&firstOuterEdgeVertices);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)local_1b0);
      std::__cxx11::string::~string((string *)local_1b0);
      return __return_storage_ptr__;
    }
    local_268 = lVar14 << 4;
    lVar11 = 0;
    local_260 = lVar14;
    while( true ) {
      p_Var13 = &firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header;
      if (lVar11 == 0xc) break;
      edgeDesc = (OuterEdgeDescription *)
                 ((long)((this->super_BaseTestInstance).m_edgeDescriptions.
                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                         ._M_impl.super__Vector_impl_data._M_start)->constantCoordinateValueChoices
                 + local_268 + -4);
      constantOuterLevel =
           (float)(&tessellation::(anonymous_namespace)::InvariantOuterEdge::BaseTestInstance::
                    m_singleOuterEdgeLevels)[lVar11];
      local_258 = lVar11;
      generatePatchTessLevels
                (&patchTessLevels,(this->super_BaseTestInstance).m_numPatchesToDraw,(int)local_260,
                 constantOuterLevel);
      firstOuterEdgeVertices._M_t._M_impl._0_1_ = 0;
      firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
      ;
      firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var13->_M_header;
      firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var13->_M_header;
      BaseTestInstance::uploadVertexAttributes(&this->super_BaseTestInstance,&patchTessLevels);
      logOuterTessellationLevel
                (((this->super_BaseTestInstance).super_TestInstance.m_context)->m_testCtx->m_log,
                 constantOuterLevel,edgeDesc);
      this_00 = (_anonymous_namespace_ *)0x0;
      while( true ) {
        winding = (Winding)this_00;
        if (winding == WINDING_LAST) break;
        for (iVar6 = 0; iVar6 != 2; iVar6 = iVar6 + 1) {
          p_Var12 = this_00;
          BaseTestInstance::draw
                    (&result,&this->super_BaseTestInstance,
                     (deUint32)
                     ((ulong)((long)patchTessLevels.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)patchTessLevels.super__Vector_base<float,_std::allocator<float>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 2),&patchTessLevels
                     ,winding,iVar6 != 0);
          dVar4 = result.numPrimitives;
          if (result.success != true) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1b0,"Invalid set of vertices",
                       (allocator<char> *)&outerEdgeVertices);
            tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_1b0);
            std::__cxx11::string::~string((string *)local_1b0);
LAB_00725ea9:
            std::
            _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
            ::~_Vector_base(&result.primitives.
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                           );
            std::
            set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
            ::~set(&firstOuterEdgeVertices);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&patchTessLevels.super__Vector_base<float,_std::allocator<float>_>);
            return __return_storage_ptr__;
          }
          uVar17 = 0;
          uVar15 = (ulong)(uint)result.numPrimitiveVertices;
          if (result.numPrimitiveVertices < 1) {
            uVar15 = uVar17;
          }
          local_240 = result.primitives.
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_248 = (result.primitives.
                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                       ._M_impl.super__Vector_impl_data._M_start)->tessCoord[0].m_data + 2;
          pfVar8 = (float *)0x0;
          while (iVar7 = (int)pfVar8, iVar7 < (this->super_BaseTestInstance).m_numPatchesToDraw) {
            outerEdgeVertices._M_t._M_impl._0_1_ = 0;
            outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header;
            outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_250 = patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
            pfVar10 = local_248 + (long)(int)uVar17 * 0x10;
            outer = pfVar8;
            outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            while ((iVar16 = (int)uVar17, iVar16 < dVar4 &&
                   (outer = pfVar8, local_240[iVar16].patchPrimitiveID == iVar7))) {
              for (lVar14 = 0; uVar15 * 0x10 != lVar14; lVar14 = lVar14 + 0x10) {
                local_1b0._8_4_ = *(float *)((long)pfVar10 + lVar14);
                local_1b0._0_8_ = *(undefined8 *)((long)pfVar10 + lVar14 + -8);
                bVar5 = OuterEdgeDescription::contains(edgeDesc,(Vec3 *)local_1b0);
                if (bVar5) {
                  std::
                  set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ::insert(&outerEdgeVertices,(Vec3 *)local_1b0);
                }
              }
              uVar17 = (ulong)(iVar16 + 1);
              pfVar10 = pfVar10 + 0x10;
            }
            if ((iVar6 == 0 && winding == WINDING_CCW) && iVar7 == 0) {
              std::
              set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
              ::operator=(&firstOuterEdgeVertices,&outerEdgeVertices);
            }
            else {
              bVar5 = std::operator!=(&firstOuterEdgeVertices,&outerEdgeVertices);
              iVar16 = (int)p_Var12;
              poVar1 = (ostringstream *)(local_1b0 + 8);
              if (bVar5) {
                pTVar3 = ((this->super_BaseTestInstance).super_TestInstance.m_context)->m_testCtx->
                         m_log;
                local_1b0._0_8_ = pTVar3;
                std::__cxx11::ostringstream::ostringstream(poVar1);
                std::operator<<((ostream *)poVar1,
                                "Failure: vertices generated for the edge differ between the following cases:\n"
                               );
                std::operator<<((ostream *)poVar1,"  - case A: ");
                tessellation::(anonymous_namespace)::getProgramDescription_abi_cxx11_
                          (&local_288,(_anonymous_namespace_ *)0x0,WINDING_CCW,SUB81(outer,0));
                std::operator<<((ostream *)poVar1,(string *)&local_288);
                std::operator<<((ostream *)poVar1,", tessellation levels: ");
                getTessellationLevelsString_abi_cxx11_
                          (&local_238,
                           (tessellation *)
                           patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_start,
                           patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_start + 2,outer);
                usePointMode = SUB81(outer,0);
                std::operator<<((ostream *)poVar1,(string *)&local_238);
                std::operator<<((ostream *)poVar1,"\n");
                std::operator<<((ostream *)poVar1,"  - case B: ");
                tessellation::(anonymous_namespace)::getProgramDescription_abi_cxx11_
                          (&local_1d0,this_00,(uint)(iVar6 != 0),(bool)usePointMode);
                std::operator<<((ostream *)poVar1,(string *)&local_1d0);
                std::operator<<((ostream *)poVar1,", tessellation levels: ");
                pfVar9 = local_250;
                getTessellationLevelsString_abi_cxx11_
                          (&local_1f0,(tessellation *)(local_250 + iVar7 * 6),
                           local_250 + (iVar7 * 6 + 2),local_250);
                iVar6 = (int)pfVar9;
                std::operator<<((ostream *)poVar1,(string *)&local_1f0);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::string::~string((string *)&local_1f0);
                std::__cxx11::string::~string((string *)&local_1d0);
                std::__cxx11::string::~string((string *)&local_238);
                std::__cxx11::string::~string((string *)&local_288);
                std::__cxx11::ostringstream::~ostringstream(poVar1);
                poVar1 = (ostringstream *)(local_1b0 + 8);
                local_1b0._0_8_ = pTVar3;
                std::__cxx11::ostringstream::ostringstream(poVar1);
                std::operator<<((ostream *)poVar1,
                                "Note: resulting vertices for the edge for the cases were:\n");
                std::operator<<((ostream *)poVar1,"  - case A: ");
                containerStr<std::set<tcu::Vector<float,3>,vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                          (&local_288,(tessellation *)&firstOuterEdgeVertices,
                           (set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            *)0xe,iVar6,iVar16);
                poVar2 = (ostream *)(local_1b0 + 8);
                std::operator<<(poVar2,(string *)&local_288);
                std::operator<<(poVar2,"\n");
                std::operator<<(poVar2,"  - case B: ");
                containerStr<std::set<tcu::Vector<float,3>,vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                          (&local_238,(tessellation *)&outerEdgeVertices,
                           (set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            *)0xe,iVar6,iVar16);
                std::operator<<((ostream *)(local_1b0 + 8),(string *)&local_238);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::string::~string((string *)&local_238);
                std::__cxx11::string::~string((string *)&local_288);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_1b0,"Invalid set of vertices",
                           (allocator<char> *)&local_288);
                tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_1b0);
                std::__cxx11::string::~string((string *)local_1b0);
                std::
                set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                ::~set(&outerEdgeVertices);
                goto LAB_00725ea9;
              }
            }
            std::
            set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
            ::~set(&outerEdgeVertices);
            pfVar8 = (float *)(ulong)(iVar7 + 1);
          }
          std::
          _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
          ::~_Vector_base(&result.primitives.
                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                         );
        }
        this_00 = (_anonymous_namespace_ *)(ulong)(winding + WINDING_CW);
      }
      std::
      set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
      ::~set(&firstOuterEdgeVertices);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&patchTessLevels.super__Vector_base<float,_std::allocator<float>_>);
      lVar11 = local_258 + 1;
    }
    lVar14 = local_260 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus OuterEdgeDivisionTestInstance::iterate (void)
{
	for (int outerEdgeIndex = 0; outerEdgeIndex < static_cast<int>(m_edgeDescriptions.size()); ++outerEdgeIndex)
	for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(m_singleOuterEdgeLevels); ++outerEdgeLevelCaseNdx)
	{
		const OuterEdgeDescription& edgeDesc        = m_edgeDescriptions[outerEdgeIndex];
		const std::vector<float>    patchTessLevels = generatePatchTessLevels(m_numPatchesToDraw, outerEdgeIndex, m_singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);

		Vec3Set firstOuterEdgeVertices; // Vertices of the outer edge of the first patch of the first program's draw call; used for comparison with other patches.

		uploadVertexAttributes(patchTessLevels);
		logOuterTessellationLevel(m_context.getTestContext().getLog(), m_singleOuterEdgeLevels[outerEdgeLevelCaseNdx], edgeDesc);

		for (int windingNdx = 0; windingNdx < WINDING_LAST; ++windingNdx)
		for (int usePointModeNdx = 0; usePointModeNdx <= 1; ++usePointModeNdx)
		{
			const Winding winding	     = static_cast<Winding>(windingNdx);
			const bool	  usePointMode   = (usePointModeNdx != 0);
			const bool    isFirstProgram = (windingNdx == 0 && usePointModeNdx == 0);

			const DrawResult result = draw(static_cast<deUint32>(patchTessLevels.size()), patchTessLevels, winding, usePointMode);

			if (!result.success)
				return tcu::TestStatus::fail("Invalid set of vertices");

			// Check the vertices of each patch.

			int primitiveNdx = 0;
			for (int patchNdx = 0; patchNdx < m_numPatchesToDraw; ++patchNdx)
			{
				DE_ASSERT(primitiveNdx < result.numPrimitives);

				const float* const	innerLevels	= &patchTessLevels[NUM_TESS_LEVELS*patchNdx + 0];
				const float* const	outerLevels	= &patchTessLevels[NUM_TESS_LEVELS*patchNdx + 2];

				Vec3Set outerEdgeVertices;

				// We're interested in just the vertices on the current outer edge.
				for (; primitiveNdx < result.numPrimitives && result.primitives[primitiveNdx].patchPrimitiveID == patchNdx; ++primitiveNdx)
				for (int i = 0; i < result.numPrimitiveVertices; ++i)
				{
					const tcu::Vec3& coord = result.primitives[primitiveNdx].tessCoord[i].swizzle(0, 1, 2);
					if (edgeDesc.contains(coord))
						outerEdgeVertices.insert(coord);
				}

				// Compare the vertices to those of the first patch (unless this is the first patch).

				if (isFirstProgram && patchNdx == 0)
					firstOuterEdgeVertices = outerEdgeVertices;
				else if (firstOuterEdgeVertices != outerEdgeVertices)
				{
					tcu::TestLog& log = m_context.getTestContext().getLog();

					log << tcu::TestLog::Message
						<< "Failure: vertices generated for the edge differ between the following cases:\n"
						<< "  - case A: " << getProgramDescription((Winding)0, (bool)0) << ", tessellation levels: "
						<< getTessellationLevelsString(&patchTessLevels[0], &patchTessLevels[2]) << "\n"
						<< "  - case B: " << getProgramDescription(winding, usePointMode) << ", tessellation levels: "
						<< getTessellationLevelsString(innerLevels, outerLevels)
						<< tcu::TestLog::EndMessage;

					log << tcu::TestLog::Message
						<< "Note: resulting vertices for the edge for the cases were:\n"
						<< "  - case A: " << containerStr(firstOuterEdgeVertices, 5, 14) << "\n"
						<< "  - case B: " << containerStr(outerEdgeVertices, 5, 14)
						<< tcu::TestLog::EndMessage;

					return tcu::TestStatus::fail("Invalid set of vertices");
				}
			}
			DE_ASSERT(primitiveNdx == result.numPrimitives);
		} // for windingNdx, usePointModeNdx
	} // for outerEdgeIndex, outerEdgeLevelCaseNdx

	return tcu::TestStatus::pass("OK");
}